

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::vector_impl::allocator_base<std::allocator<unsigned_char>_>::allocator_base
          (allocator_base<std::allocator<unsigned_char>_> *this,
          allocator_base<std::allocator<unsigned_char>_> *a)

{
  allocator_type *__rhs;
  difference_type dVar1;
  size_t n;
  allocator_traits<std::allocator<unsigned_char>_> local_19;
  allocator_base<std::allocator<unsigned_char>_> *local_18;
  allocator_base<std::allocator<unsigned_char>_> *a_local;
  allocator_base<std::allocator<unsigned_char>_> *this_local;
  
  local_18 = a;
  a_local = this;
  __rhs = get_allocator_ref(a);
  std::allocator_traits<std::allocator<unsigned_char>_>::select_on_container_copy_construction
            (&local_19,__rhs);
  allocator_base(this,(allocator_type *)&local_19);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)&local_19);
  dVar1 = size(local_18);
  if (dVar1 != 0) {
    n = size(local_18);
    allocate(this,n);
  }
  return;
}

Assistant:

allocator_base(const allocator_base& a)
            : allocator_base(
                allocator_traits::select_on_container_copy_construction(a.get_allocator_ref()))
        {
            if (a.size()) {
                allocate(a.size());
            }
        }